

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sift.cc
# Opt level: O1

void __thiscall features::Sift::generate_grad_ori_images(Sift *this,Octave *octave)

{
  ImageVector *this_00;
  ImageVector *this_01;
  int iVar1;
  int iVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_02;
  pointer pfVar4;
  pointer psVar5;
  Image<float> *__p;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__p_00;
  long lVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  bool bVar11;
  float fVar12;
  float fVar13;
  float __y;
  undefined1 local_88 [8];
  Ptr grad;
  Ptr ori;
  
  this_00 = &octave->grad;
  std::
  vector<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
  ::clear(this_00);
  std::
  vector<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
  ::reserve(this_00,(long)(octave->img).
                          super__Vector_base<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(octave->img).
                          super__Vector_base<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 4);
  this_01 = &octave->ori;
  std::
  vector<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
  ::clear(this_01);
  std::
  vector<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
  ::reserve(this_01,(long)(octave->img).
                          super__Vector_base<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(octave->img).
                          super__Vector_base<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 4);
  psVar5 = (octave->img).
           super__Vector_base<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((octave->img).
      super__Vector_base<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != psVar5) {
    peVar3 = (psVar5->super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    iVar1 = (peVar3->super_TypedImageBase<float>).super_ImageBase.w;
    iVar2 = (peVar3->super_TypedImageBase<float>).super_ImageBase.h;
    ori.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(long)(iVar2 * iVar1);
    uVar9 = 0;
    do {
      peVar3 = psVar5[uVar9].super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      this_02 = psVar5[uVar9].super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_02->_M_use_count = this_02->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_02->_M_use_count = this_02->_M_use_count + 1;
        }
      }
      __p = (Image<float> *)operator_new(0x30);
      (__p->super_TypedImageBase<float>).super_ImageBase.w = 0;
      (__p->super_TypedImageBase<float>).super_ImageBase.h = 0;
      (__p->super_TypedImageBase<float>).super_ImageBase.c = 0;
      (__p->super_TypedImageBase<float>).data.super__Vector_base<float,_std::allocator<float>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__p->super_TypedImageBase<float>).data.super__Vector_base<float,_std::allocator<float>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__p->super_TypedImageBase<float>).data.super__Vector_base<float,_std::allocator<float>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__p->super_TypedImageBase<float>).super_ImageBase._vptr_ImageBase =
           (_func_int **)&PTR__TypedImageBase_00125ba0;
      if ((__p->super_TypedImageBase<float>).data.super__Vector_base<float,_std::allocator<float>_>.
          _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
        (__p->super_TypedImageBase<float>).data.super__Vector_base<float,_std::allocator<float>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      }
      (__p->super_TypedImageBase<float>).super_ImageBase.w = iVar1;
      (__p->super_TypedImageBase<float>).super_ImageBase.h = iVar2;
      (__p->super_TypedImageBase<float>).super_ImageBase.c = 1;
      std::vector<float,_std::allocator<float>_>::resize
                (&(__p->super_TypedImageBase<float>).data,
                 (size_type)
                 ori.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
      local_88 = (undefined1  [8])__p;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<core::Image<float>*>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&grad,__p);
      __p_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x30);
      *(undefined8 *)&__p_00->_M_use_count = 0;
      *(int *)&__p_00[1]._vptr__Sp_counted_base = 0;
      __p_00[1]._M_use_count = 0;
      __p_00[1]._M_weak_count = 0;
      __p_00[2]._vptr__Sp_counted_base = (_func_int **)0x0;
      *(pointer *)&__p_00[2]._M_use_count = (pointer)0x0;
      (((TypedImageBase<float> *)&__p_00->_vptr__Sp_counted_base)->super_ImageBase)._vptr_ImageBase
           = (_func_int **)&PTR__TypedImageBase_00125ba0;
      if (__p_00[2]._vptr__Sp_counted_base != (_func_int **)0x0) {
        __p_00[2]._vptr__Sp_counted_base = (_func_int **)0x0;
      }
      __p_00->_M_use_count = iVar1;
      __p_00->_M_weak_count = iVar2;
      *(int *)&__p_00[1]._vptr__Sp_counted_base = 1;
      std::vector<float,_std::allocator<float>_>::resize
                ((vector<float,_std::allocator<float>_> *)&__p_00[1]._M_use_count,
                 (size_type)
                 ori.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
      grad.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           __p_00;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<core::Image<float>*>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&ori,(Image<float> *)__p_00);
      if (2 < iVar2) {
        iVar7 = iVar1 + 1;
        iVar8 = 1;
        do {
          if (2 < iVar1) {
            lVar6 = (long)iVar7;
            lVar10 = 0;
            do {
              pfVar4 = (peVar3->super_TypedImageBase<float>).data.
                       super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start;
              fVar13 = (pfVar4[lVar6 + lVar10 + 1U] - pfVar4[lVar6 + lVar10 + 0xffffffffffffffffU])
                       * 0.5;
              __y = (pfVar4[lVar6 + iVar1 + lVar10] - pfVar4[lVar6 + (lVar10 - iVar1)]) * 0.5;
              fVar12 = atan2f(__y,fVar13);
              fVar13 = fVar13 * fVar13 + __y * __y;
              if (fVar13 < 0.0) {
                fVar13 = sqrtf(fVar13);
              }
              else {
                fVar13 = SQRT(fVar13);
              }
              (((TypedImageBase<float> *)local_88)->data).
              super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_start[lVar6 + lVar10] = fVar13;
              *(uint *)(*(long *)&grad.
                                  super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi[1]._M_use_count + lVar6 * 4 + lVar10 * 4) =
                   -(uint)(fVar12 < 0.0) & (uint)(fVar12 + 6.2831855) |
                   ~-(uint)(fVar12 < 0.0) & (uint)fVar12;
              lVar10 = lVar10 + 1;
            } while (iVar1 + -2 != (int)lVar10);
            iVar7 = iVar7 + (int)lVar10;
          }
          iVar7 = iVar7 + 2;
          bVar11 = iVar8 != iVar2 + -2;
          iVar8 = iVar8 + 1;
        } while (bVar11);
      }
      std::
      vector<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
      ::push_back(this_00,(value_type *)local_88);
      std::
      vector<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
      ::push_back(this_01,(value_type *)
                          &grad.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount);
      if (ori.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   ori.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
      if (grad.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   grad.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
      if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02);
      }
      uVar9 = uVar9 + 1;
      psVar5 = (octave->img).
               super__Vector_base<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar9 < (ulong)((long)(octave->img).
                                   super__Vector_base<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)psVar5 >> 4));
  }
  return;
}

Assistant:

void
Sift::generate_grad_ori_images (Octave* octave)
{
    octave->grad.clear();
    octave->grad.reserve(octave->img.size());
    octave->ori.clear();
    octave->ori.reserve(octave->img.size());

    int const width = octave->img[0]->width();
    int const height = octave->img[0]->height();

    //std::cout << "Generating gradient and orientation images..." << std::endl;
    for (std::size_t i = 0; i < octave->img.size(); ++i)
    {
        core::FloatImage::ConstPtr img = octave->img[i];
        core::FloatImage::Ptr grad = core::FloatImage::create(width, height, 1);
        core::FloatImage::Ptr ori = core::FloatImage::create(width, height, 1);

        int image_iter = width + 1;
        for (int y = 1; y < height - 1; ++y, image_iter += 2)
            for (int x = 1; x < width - 1; ++x, ++image_iter)
            {
                float m1x = img->at(image_iter - 1);
                float p1x = img->at(image_iter + 1);
                float m1y = img->at(image_iter - width);
                float p1y = img->at(image_iter + width);
                float dx = 0.5f * (p1x - m1x);
                float dy = 0.5f * (p1y - m1y);

                float atan2f = std::atan2(dy, dx);
                grad->at(image_iter) = std::sqrt(dx * dx + dy * dy);
                ori->at(image_iter) = atan2f < 0.0f
                    ? atan2f + MATH_PI * 2.0f : atan2f;
            }
        octave->grad.push_back(grad);
        octave->ori.push_back(ori);
    }
}